

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 02-basic.cpp
# Opt level: O2

void bar(Slacking *slack)

{
  allocator local_83;
  allocator local_82;
  allocator local_81;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_60,"#mychannel",&local_83);
  std::__cxx11::string::string((string *)&local_80,"botname",&local_81);
  std::__cxx11::string::string((string *)&local_40,":bird:",&local_82);
  ::slack::_detail::CategoryChat::channel_username_iconemoji
            (&slack->chat,&local_60,&local_80,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string
            ((string *)&local_60,"bar() function is called",(allocator *)&local_40);
  std::__cxx11::string::string((string *)&local_80,"",&local_83);
  ::slack::_detail::CategoryChat::postMessage
            ((CategoryChat *)&stack0xffffffffffffffe0,&(slack->chat).channel,&local_60);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&stack0xffffffffffffffe0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void bar(slack::Slacking& slack) {
    // You can try catch API method if an error occur
    try {
        slack.chat.channel_username_iconemoji("#mychannel", "botname", ":bird:"); // for lazy people
        slack.chat.postMessage("bar() function is called");
    }
    catch(std::exception const& e) {
        std::cerr << e.what() << '\n';
    }
}